

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

bool Guest_ContactHost(void *userdata)

{
  int iVar1;
  char local_64;
  char local_63;
  byte local_62;
  byte local_61;
  PreGamePacket packet;
  sockaddr_in *from;
  void *userdata_local;
  
  local_64 = '0';
  local_63 = '\0';
  PreSend(&local_64,2,sendaddress + 1);
  while( true ) {
    do {
      packet.machines[7] = (anon_struct_8_4_8d968fe9)PreGet(&local_64,0x44,true);
      if (packet.machines[7] == (anon_struct_8_4_8d968fe9)0x0) {
        (*StartScreen->_vptr_FStartupScreen[6])(StartScreen,0);
        return false;
      }
    } while ((local_64 != '0') || (iVar1 = FindNode((sockaddr_in *)packet.machines[7]), iVar1 != 1))
    ;
    if (local_63 == '\x04') break;
    if (local_63 == '\x02') {
      doomcom.numnodes = 0;
      I_FatalError("The host cancelled the game.");
    }
    else if (local_63 == '\x05') {
      doomcom.numnodes = 0;
      I_FatalError("The game is full.");
    }
  }
  (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Total players: %d",(ulong)local_62);
  (*StartScreen->_vptr_FStartupScreen[5])(StartScreen,"Waiting for other players",(ulong)local_62);
  (*StartScreen->_vptr_FStartupScreen[6])(StartScreen,(ulong)local_61);
  return true;
}

Assistant:

bool Guest_ContactHost (void *userdata)
{
	sockaddr_in *from;
	PreGamePacket packet;

	// Let the host know we are here.
	packet.Fake = PRE_FAKE;
	packet.Message = PRE_CONNECT;
	PreSend (&packet, 2, &sendaddress[1]);

	// Listen for a reply.
	while ( (from = PreGet (&packet, sizeof(packet), true)) )
	{
		if (packet.Fake == PRE_FAKE && FindNode(from) == 1)
		{
			if (packet.Message == PRE_CONACK)
			{
				StartScreen->NetMessage ("Total players: %d", packet.NumNodes);
				StartScreen->NetInit ("Waiting for other players", packet.NumNodes);
				StartScreen->NetProgress (packet.NumPresent);
				return true;
			}
			else if (packet.Message == PRE_DISCONNECT)
			{
				doomcom.numnodes = 0;
				I_FatalError ("The host cancelled the game.");
			}
			else if (packet.Message == PRE_ALLFULL)
			{
				doomcom.numnodes = 0;
				I_FatalError ("The game is full.");
			}
		}
	}

	// In case the progress bar could not be marqueed, bump it.
	StartScreen->NetProgress (0);

	return false;
}